

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

void __thiscall
wasm::TranslateToFuzzReader::FunctionCreationContext::FunctionCreationContext
          (FunctionCreationContext *this,TranslateToFuzzReader *parent,Function *func)

{
  Expression **ppEVar1;
  pointer pTVar2;
  undefined1 auStack_108 [8];
  Finder finder;
  
  this->parent = parent;
  this->func = func;
  (this->hangStack).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->hangStack).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->hangStack).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->breakableStack).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->breakableStack).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->breakableStack).
           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->breakableStack).
           super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->typeLocals)._M_h._M_buckets = &(this->typeLocals)._M_h._M_single_bucket;
  (this->typeLocals)._M_h._M_bucket_count = 1;
  (this->typeLocals)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->typeLocals)._M_h._M_element_count = 0;
  (this->typeLocals)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->typeLocals)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->typeLocals)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  parent->funcContext = this;
  computeTypeLocals(this);
  if (func->body != (Expression *)0x0) {
    auStack_108 = (undefined1  [8])0x0;
    finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
    super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.replacep =
         (Expression **)0x0;
    finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
    super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.fixed._M_elems[9].
    currp = (Expression **)0x0;
    finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
    super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
    super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
    super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
    super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
    super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
    super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.currFunction._0_4_ = 0;
    finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
    super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>._204_8_ = 0;
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)auStack_108,
               PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::scan,&func->body);
    if (((long)finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
               super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
               super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.fixed.
               _M_elems[9].currp >> 4) +
        (long)finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
              super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.replacep != 0) {
      do {
        if ((pointer)finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                     super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.fixed
                     ._M_elems[9].currp ==
            finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
            super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
              super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.replacep ==
              (Expression **)0x0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x7e,
                          "T &wasm::SmallVector<wasm::Walker<Finder, wasm::UnifiedExpressionVisitor<Finder>>::Task, 10>::back() [T = wasm::Walker<Finder, wasm::UnifiedExpressionVisitor<Finder>>::Task, N = 10]"
                         );
          }
          pTVar2 = (pointer)&finder.
                             super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>
                             .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                             stack.fixed._M_elems
                             [(long)finder.
                                    super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>
                                    .
                                    super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>
                                    .replacep + -2].currp;
        }
        else {
          pTVar2 = finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                   super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.
                   flexible.
                   super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
                   ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        ppEVar1 = pTVar2->currp;
        if ((pointer)finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                     super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.fixed
                     ._M_elems[9].currp ==
            finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
            super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
            super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          if (finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
              super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.replacep ==
              (Expression **)0x0) {
            __assert_fail("usedFixed > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                          ,0x75,
                          "void wasm::SmallVector<wasm::Walker<Finder, wasm::UnifiedExpressionVisitor<Finder>>::Task, 10>::pop_back() [T = wasm::Walker<Finder, wasm::UnifiedExpressionVisitor<Finder>>::Task, N = 10]"
                         );
          }
          finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
          super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.replacep =
               (Expression **)
               ((long)finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>
                      .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.replacep
               + -1);
        }
        else {
          finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
          super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
          super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
          ._M_impl.super__Vector_impl_data._M_start =
               finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
               super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start + -1;
        }
        auStack_108 = (undefined1  [8])ppEVar1;
        if (*ppEVar1 == (Expression *)0x0) {
          __assert_fail("*task.currp",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                        ,0x132,
                        "void wasm::Walker<Finder, wasm::UnifiedExpressionVisitor<Finder>>::walk(Expression *&) [SubType = Finder, VisitorType = wasm::UnifiedExpressionVisitor<Finder>]"
                       );
        }
        (*pTVar2->func)((Finder *)auStack_108,ppEVar1);
      } while (((long)finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>
                      .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.
                      flexible.
                      super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>
                      .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.
                      fixed._M_elems[9].currp >> 4) +
               (long)finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                     super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.replacep !=
               0);
    }
    this->labelIndex =
         (Index)finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.currModule;
    if (finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
        super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.fixed._M_elems[9].
        currp != (Expression **)0x0) {
      operator_delete(finder.super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>
                      .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack.
                      fixed._M_elems[9].currp,
                      (long)finder.
                            super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                            super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                            stack.flexible.
                            super__Vector_base<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task,_std::allocator<wasm::Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)finder.
                            super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                            super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.
                            stack.fixed._M_elems[9].currp);
    }
  }
  return;
}

Assistant:

TranslateToFuzzReader::FunctionCreationContext::FunctionCreationContext(
  TranslateToFuzzReader& parent, Function* func)
  : parent(parent), func(func) {
  parent.funcContext = this;

  // Note the types of all locals.
  computeTypeLocals();

  // Find the right index for labelIndex: we emit names like label$5, so we need
  // the index to be larger than all currently existing.
  if (!func->body) {
    return;
  }

  struct Finder : public PostWalker<Finder, UnifiedExpressionVisitor<Finder>> {
    Index maxIndex = 0;

    void visitExpression(Expression* curr) {
      // Note all scope names, and fix up all uses.
      BranchUtils::operateOnScopeNameDefs(curr, [&](Name& name) {
        if (name.is()) {
          if (name.startsWith("label$")) {
            auto str = name.toString();
            str = str.substr(6);
            Index index = atoi(str.c_str());
            maxIndex = std::max(maxIndex, index + 1);
          }
        }
      });
    }
  } finder;
  finder.walk(func->body);
  labelIndex = finder.maxIndex;
}